

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

Status uncompress(Header *header,FILE *ifp,FILE *ofp,CompType type)

{
  byte bVar1;
  uint uVar2;
  Ferror FVar3;
  uint uVar4;
  undefined **ppuVar5;
  Status SVar6;
  char *pcVar7;
  count_int *pcVar8;
  Byte local_55;
  uint local_54;
  count_int *pcVar9;
  
  init_garble();
  crc = 0;
  offset = 0;
  size = 0;
  clear_flg = 0;
  readsize = (long)header->complen;
  if (type == UNIX_COMPRESS) {
    read_byte(ifp);
    read_byte(ifp);
    bVar1 = read_byte(ifp);
    bVar1 = bVar1 & 0x1f;
    maxbits = (int)bVar1;
    readsize = readsize + -3;
  }
  else if (type == SQUASH) {
    maxbits = 0xd;
    bVar1 = 0xd;
  }
  else if (arcfs == 0) {
    bVar1 = read_byte(ifp);
    maxbits = (int)bVar1;
    readsize = readsize + -1;
  }
  else {
    maxbits = arcfs_maxbits;
    ungarble('\0');
    bVar1 = (byte)maxbits;
  }
  maxmaxcode = ~(-1 << (bVar1 & 0x1f));
  n_bits = 9;
  maxcode = 0x1ff;
  for (uVar2 = 0xff; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    codetab[uVar2] = 0;
    *(char *)((long)htab + (ulong)uVar2) = (char)uVar2;
  }
  free_ent = 0x101;
  uVar2 = getcode(ifp);
  if (uVar2 != 0xffffffff) {
    local_55 = (Byte)uVar2;
    if (type == CRUNCH) {
      putc_init();
      putc_ncr(ofp,local_55);
    }
    else {
      if (testing == '\0') {
        write_byte(ofp,local_55);
      }
      calccrc(local_55);
    }
    pcVar8 = htab + 0x4000;
    while ((local_54 = uVar2, uVar2 = getcode(ifp), uVar2 != 0xffffffff &&
           (FVar3 = check_stream(ifp), FVar3 == FNOERR))) {
      if (uVar2 == 0x100) {
        for (uVar2 = 0xff; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
          codetab[uVar2] = 0;
        }
        clear_flg = 1;
        free_ent = 0x100;
        uVar2 = getcode(ifp);
        if (uVar2 == 0xffffffff) break;
      }
      pcVar9 = pcVar8;
      uVar4 = uVar2;
      if (free_ent <= (int)uVar2) {
        *(Byte *)pcVar8 = local_55;
        pcVar9 = (count_int *)((long)pcVar8 + 1);
        uVar4 = local_54;
      }
      for (; pcVar8 = (count_int *)((long)pcVar9 + 1), 0xff < (int)uVar4;
          uVar4 = (uint)codetab[uVar4]) {
        if (&free_ent < pcVar8) goto LAB_00103bde;
        *(Byte *)pcVar9 = *(Byte *)((long)htab + (ulong)uVar4);
        pcVar9 = pcVar8;
      }
      if (&free_ent < pcVar8) {
LAB_00103bde:
        error("%s: uncompress: corrupt or garbled archive file",ourname);
        exit(1);
      }
      local_55 = *(Byte *)((long)htab + (long)(int)uVar4);
      *(Byte *)pcVar9 = local_55;
      while (htab + 0x4000 < pcVar8) {
        pcVar8 = (count_int *)((long)pcVar8 + -1);
        if (type == CRUNCH) {
          putc_ncr(ofp,*(Byte *)pcVar8);
        }
        else {
          if (testing == '\0') {
            write_byte(ofp,*(Byte *)pcVar8);
          }
          calccrc(*(Byte *)pcVar8);
        }
      }
      if (free_ent < maxmaxcode) {
        codetab[free_ent] = (unsigned_short)local_54;
        *(Byte *)((long)htab + (long)free_ent) = local_55;
        free_ent = free_ent + 1;
      }
    }
  }
  FVar3 = check_stream(ifp);
  if (FVar3 == FRWERR) {
    SVar6 = RERR;
  }
  else if ((testing == '\0') && (FVar3 = check_stream(ofp), FVar3 == FRWERR)) {
    SVar6 = WERR;
  }
  else if (header->crc == (Halfword)crc) {
    if (type < 4) {
      ppuVar5 = &PTR_anon_var_dwarf_1967_00107da8;
      if (testing == '\0') {
        ppuVar5 = &PTR_anon_var_dwarf_19b7_00107dc8;
      }
      pcVar7 = ppuVar5[type];
    }
    else {
      pcVar7 = "internal error";
    }
    SVar6 = NOERR;
    if (quiet == '\0') {
      SVar6 = NOERR;
      msg("%s",pcVar7);
    }
  }
  else {
    SVar6 = CRCERR;
  }
  return SVar6;
}

Assistant:

Status
uncompress(Header *header, FILE *ifp, FILE *ofp, CompType type)
{
	/* BB changed next line. stackp points to huge pointers. */
	register char_type NSHUGE *stackp;
	register code_int finchar;
	register code_int code, oldcode, incode;
	char *message;

	init_garble();

#if !defined(BB_HUGE_STATIC_ARRAYS)
	if (!htab)
		htab = (count_int NSHUGE *) farcalloc(HSIZE, sizeof(count_int));
	if (!codetab)
		codetab =
			(unsigned short NSHUGE *) farcalloc(HSIZE,
											  sizeof(unsigned short));
	if (!htab || !codetab)
	{
		error("%s: uncompress: out of memory", ourname);
		exit(1);
	}
#endif							/* ! BB_HUGE_STATIC_ARRAYS */

	crc = 0;
	clear_flg = 0;
	offset = 0;
	size = 0;
	readsize = header->complen;

	if (type == SQUASH)
		maxbits = SQUASHBITS;
	else if (type == UNIX_COMPRESS)
	{
		/* Read the unix compress header */
		read_byte(ifp);
		read_byte(ifp);
		maxbits = read_byte(ifp) & 0x1f;
		readsize -= 3;
	}
	else
	{
		if (arcfs)
		{
			maxbits = arcfs_maxbits;
			ungarble('\0'); // Need to consume one byte of password.
		}
		else
		{
			maxbits = read_byte(ifp);
			readsize--;
		}
	}
	maxmaxcode = MAXCODE(maxbits);

	/*
	 * As above, initialize the first 256 entries in the table.
	 */
	maxcode = MAXCODE(n_bits = INIT_BITS);
	for (code = 255; code >= 0; code--)
	{
		tab_prefixof(code) = 0;
		tab_suffixof(code) = (char_type) code;
	}
	free_ent = FIRST;

	finchar = oldcode = getcode(ifp);
	if (oldcode == -1)			/* EOF already? */
		goto compress_exit;		/* Get out of here */

	/* first code must be 8 bits = char */
	if (type == CRUNCH)
	{
		putc_init();
		/* BB changed next line for Borland C/C++ 4 */
		putc_ncr(ofp, (Byte) finchar);
	}
	else
	{
		/* BB changed next three lines for Borland C/C++ 4 */
		if (!testing)
			write_byte(ofp, (Byte) finchar);
		calccrc((Byte) finchar);
	}

	stackp = de_stack;

	while ((code = getcode(ifp)) != -1)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		if (code == CLEAR)
		{
			for (code = 255; code >= 0; code--)
				tab_prefixof(code) = 0;
			clear_flg = 1;
			free_ent = FIRST - 1;
			if ((code = getcode(ifp)) == -1)	/* O, untimely death! */
				break;
		}
		incode = code;
		/*
		 * Special case for KwKwK string.
		 */
		if (code >= free_ent)
		{
			/* BB changed next line for Borland C/C++ 4 */
			*stackp++ = (char_type) finchar;
			code = oldcode;
		}
		/*
		 * Generate output characters in reverse order
		 */

		while (code >= 256)
		{
			if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
			{
				error("%s: uncompress: corrupt or garbled archive file", ourname);
				exit(1);
			}
			*stackp++ = tab_suffixof(code);
			code = tab_prefixof(code);
		}
		if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
		{
			error("%s: uncompress: corrupt or garbled archive file", ourname);
			exit(1);
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* *stackp++ = finchar = tab_suffixof(code); */
		finchar = tab_suffixof(code);
		*stackp++ = (char_type) finchar;

		/*
		 * And put them out in forward order
		 */
		while (stackp > de_stack)
		{
			stackp--;
			if (type == CRUNCH)
				putc_ncr(ofp, *stackp);
			else
			{
				if (!testing)
					write_byte(ofp, *stackp);
				calccrc(*stackp);
			}
		}

		/*
		 * Generate the new entry.
		 */
		if ((code = free_ent) < maxmaxcode)
		{
			/* BB changed next two lines for Borland C/C++ 4 */
			tab_prefixof(code) = (unsigned short) oldcode;
			tab_suffixof(code) = (char_type) finchar;
			free_ent = code + 1;
		}
		/*
		 * Remember previous code.
		 */
		oldcode = incode;
	}
  compress_exit:
	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "OK (compressed)";
			break;
		case CRUNCH:
			message = "OK (crunched)";
			break;
		case SQUASH:
			message = "OK (squashed)";
			break;
		default:
			message = "internal error";
			break;
		}
	else
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "uncompressed";
			break;
		case CRUNCH:
			message = "uncrunched";
			break;
		case SQUASH:
			message = "unsquashed";
			break;
		default:
			message = "internal error";
			break;
		}
	if (!quiet)
		msg("%s", message);
	return (NOERR);
}